

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_d_generator.cc
# Opt level: O2

string * __thiscall
t_d_generator::render_type_name_abi_cxx11_
          (string *__return_storage_ptr__,t_d_generator *this,t_type *ttype,bool isArg)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  t_type *ptVar3;
  char *pcVar4;
  string *this_00;
  t_base_type *this_01;
  undefined1 auVar5 [12];
  string sStack_68;
  string local_48;
  undefined4 extraout_var_00;
  
  this_00 = &sStack_68;
  iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[5])(ttype);
  if ((char)iVar2 != '\0') {
    this_01 = (t_base_type *)(ulong)*(uint *)&ttype[1].super_t_doc._vptr_t_doc;
    switch(this_01) {
    case (t_base_type *)0x0:
      pcVar4 = "void";
      break;
    case (t_base_type *)0x1:
      pcVar4 = "string";
      break;
    case (t_base_type *)0x2:
      pcVar4 = "bool";
      break;
    case (t_base_type *)0x3:
      pcVar4 = "byte";
      break;
    case (t_base_type *)0x4:
      pcVar4 = "short";
      break;
    case (t_base_type *)0x5:
      pcVar4 = "int";
      break;
    case (t_base_type *)0x6:
      pcVar4 = "long";
      break;
    case (t_base_type *)0x7:
      pcVar4 = "double";
      break;
    default:
      auVar5 = __cxa_allocate_exception(0x20);
      t_base_type::t_base_name_abi_cxx11_(&sStack_68,this_01,auVar5._8_4_);
      std::operator+(auVar5._0_8_,"Compiler error: No D type name for base type ",&sStack_68);
      __cxa_throw(auVar5._0_8_,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
    }
    std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar4,(allocator *)&sStack_68);
    return __return_storage_ptr__;
  }
  iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xd])(ttype);
  if ((char)iVar2 != '\0') {
    if (ttype[1].super_t_doc.doc_.field_2._M_local_buf[8] == '\x01') {
      ptVar3 = ttype + 1;
      goto LAB_0018d7b9;
    }
    iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])(ttype);
    if ((char)iVar2 != '\0') {
      ptVar3 = *(t_type **)&ttype[1].super_t_doc.has_doc_;
      render_type_name_abi_cxx11_
                (&sStack_68,this,*(t_type **)&ttype[1].annotations_._M_t._M_impl,false);
      std::operator+(__return_storage_ptr__,&sStack_68,"[");
      std::__cxx11::string::~string((string *)&sStack_68);
      bVar1 = is_immutable_type(this,ptVar3);
      if (!bVar1) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      render_type_name_abi_cxx11_(&sStack_68,this,ptVar3,false);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&sStack_68);
      bVar1 = is_immutable_type(this,ptVar3);
      if (!bVar1) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])(ttype);
    if ((char)iVar2 != '\0') {
      render_type_name_abi_cxx11_(&local_48,this,*(t_type **)&ttype[1].super_t_doc.has_doc_,false);
      std::operator+(&sStack_68,"HashSet!(",&local_48);
      std::operator+(__return_storage_ptr__,&sStack_68,")");
      std::__cxx11::string::~string((string *)&sStack_68);
      this_00 = &local_48;
      goto LAB_0018d7a3;
    }
    iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])(ttype);
    if ((char)iVar2 != '\0') {
      render_type_name_abi_cxx11_(&sStack_68,this,*(t_type **)&ttype[1].super_t_doc.has_doc_,false);
      std::operator+(__return_storage_ptr__,&sStack_68,"[]");
      this_00 = &sStack_68;
      goto LAB_0018d7a3;
    }
  }
  iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xb])(ttype);
  if (((byte)iVar2 & isArg) == 1) {
    iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[3])(ttype);
    std::operator+(&sStack_68,"ref const(",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(extraout_var,iVar2));
    std::operator+(__return_storage_ptr__,&sStack_68,")");
LAB_0018d7a3:
    std::__cxx11::string::~string((string *)this_00);
    return __return_storage_ptr__;
  }
  iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[3])(ttype);
  ptVar3 = (t_type *)CONCAT44(extraout_var_00,iVar2);
LAB_0018d7b9:
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)ptVar3);
  return __return_storage_ptr__;
}

Assistant:

string render_type_name(const t_type* ttype, bool isArg = false) const {
    if (ttype->is_base_type()) {
      t_base_type::t_base tbase = ((t_base_type*)ttype)->get_base();
      switch (tbase) {
      case t_base_type::TYPE_VOID:
        return "void";
      case t_base_type::TYPE_STRING:
        return "string";
      case t_base_type::TYPE_BOOL:
        return "bool";
      case t_base_type::TYPE_I8:
        return "byte";
      case t_base_type::TYPE_I16:
        return "short";
      case t_base_type::TYPE_I32:
        return "int";
      case t_base_type::TYPE_I64:
        return "long";
      case t_base_type::TYPE_DOUBLE:
        return "double";
      default:
        throw "Compiler error: No D type name for base type " + t_base_type::t_base_name(tbase);
      }
    }

    if (ttype->is_container()) {
      t_container* tcontainer = (t_container*)ttype;
      if (tcontainer->has_cpp_name()) {
        return tcontainer->get_cpp_name();
      } else if (ttype->is_map()) {
        t_map* tmap = (t_map*)ttype;
        t_type* ktype = tmap->get_key_type();

        string name = render_type_name(tmap->get_val_type()) + "[";
        if (!is_immutable_type(ktype)) {
          name += "immutable(";
        }
        name += render_type_name(ktype);
        if (!is_immutable_type(ktype)) {
          name += ")";
        }
        name += "]";
        return name;
      } else if (ttype->is_set()) {
        t_set* tset = (t_set*)ttype;
        return "HashSet!(" + render_type_name(tset->get_elem_type()) + ")";
      } else if (ttype->is_list()) {
        t_list* tlist = (t_list*)ttype;
        return render_type_name(tlist->get_elem_type()) + "[]";
      }
    }

    if (ttype->is_struct() && isArg) {
      return "ref const(" + ttype->get_name() + ")";
    } else {
      return ttype->get_name();
    }
  }